

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

int Ssw_SmlCountXorImplication(Ssw_Sml_t *p,Aig_Obj_t *pObjLi,Aig_Obj_t *pObjLo,Aig_Obj_t *pCand)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  if ((pObjLo->field_0x18 & 8) == 0) {
    iVar4 = p->nWordsTotal;
    lVar1 = (long)(*(int *)(((ulong)pCand & 0xfffffffffffffffe) + 0x24) * iVar4) * 4;
    lVar2 = (long)(pObjLi->Id * iVar4) * 4;
    lVar3 = (long)(pObjLo->Id * iVar4) * 4;
    lVar7 = (long)p->nWordsPref;
    iVar6 = 0;
    if ((((uint)pCand ^ *(uint *)(((ulong)pCand & 0xfffffffffffffffe) + 0x18) >> 3) & 1) == 0) {
      for (; lVar7 < iVar4; lVar7 = lVar7 + 1) {
        iVar5 = Aig_WordCountOnes(~(*(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar2) ^
                                   *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar3)) &
                                  *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar1));
        iVar6 = iVar6 + iVar5;
      }
    }
    else {
      for (; lVar7 < iVar4; lVar7 = lVar7 + 1) {
        iVar5 = Aig_WordCountOnes(~(*(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar3) ^
                                    *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar2) |
                                   *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar1)));
        iVar6 = iVar6 + iVar5;
      }
    }
    return iVar6;
  }
  __assert_fail("pObjLo->fPhase == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                ,0xf1,
                "int Ssw_SmlCountXorImplication(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)"
               );
}

Assistant:

int Ssw_SmlCountXorImplication( Ssw_Sml_t * p, Aig_Obj_t * pObjLi, Aig_Obj_t * pObjLo, Aig_Obj_t * pCand )
{
    unsigned * pSimLi, * pSimLo, * pSimCand;
    int k, Counter = 0;
    assert( pObjLo->fPhase == 0 );
    // pObjLi->fPhase may be 1, but the LI simulation data is not complemented!
    pSimCand = Ssw_ObjSim( p, Aig_Regular(pCand)->Id );
    pSimLi   = Ssw_ObjSim( p, pObjLi->Id );
    pSimLo   = Ssw_ObjSim( p, pObjLo->Id );
    if ( Aig_Regular(pCand)->fPhase ^ Aig_IsComplement(pCand) )
    {
        for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
            Counter += Aig_WordCountOnes(~pSimCand[k] & ~(pSimLi[k] ^ pSimLo[k]));
    }
    else
    {
        for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
            Counter += Aig_WordCountOnes(pSimCand[k] & ~(pSimLi[k] ^ pSimLo[k]));
    }
    return Counter;
}